

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QLocalSocket_*>::takeFirst(QList<QLocalSocket_*> *this)

{
  QLocalSocket **ppQVar1;
  QPodArrayOps<QLocalSocket_*> *this_00;
  QArrayDataPointer<QLocalSocket_*> *in_RDI;
  value_type v;
  QList<QLocalSocket_*> *in_stack_fffffffffffffff0;
  QLocalSocket *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QLocalSocket_*> *)QArrayDataPointer<QLocalSocket_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QLocalSocket_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }